

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

DataSegment *
wasm::
addModuleElement<std::vector<std::unique_ptr<wasm::DataSegment,std::default_delete<wasm::DataSegment>>,std::allocator<std::unique_ptr<wasm::DataSegment,std::default_delete<wasm::DataSegment>>>>,std::unordered_map<wasm::Name,wasm::DataSegment*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::DataSegment*>>>,wasm::DataSegment>
          (vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           *v,unordered_map<wasm::Name,_wasm::DataSegment_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DataSegment_*>_>_>
              *m,unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *curr,
          string *funcName)

{
  ostream *this;
  DataSegment *pDVar1;
  char *pcVar2;
  mapped_type __k;
  mapped_type pDVar3;
  mapped_type *ppDVar4;
  string *psVar5;
  Name name;
  Name name_00;
  undefined1 local_1b0 [392];
  
  pDVar1 = (curr->_M_t).
           super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
           super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
           super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
  pcVar2 = *(char **)((long)&(pDVar1->super_Named).name + 8);
  if (pcVar2 == (char *)0x0) {
    Fatal::Fatal((Fatal *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 0x10),"Module::",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 0x10),(funcName->_M_dataplus)._M_p,funcName->_M_string_length
              );
    Fatal::operator<<((Fatal *)local_1b0,(char (*) [13])": empty name");
  }
  else {
    name.super_IString.str._M_str = (char *)funcName;
    name.super_IString.str._M_len = (size_t)pcVar2;
    psVar5 = funcName;
    pDVar3 = getModuleElementOrNull<std::unordered_map<wasm::Name,wasm::DataSegment*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::DataSegment*>>>>
                       ((wasm *)m,
                        *(unordered_map<wasm::Name,_wasm::DataSegment_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DataSegment_*>_>_>
                          **)&(pDVar1->super_Named).name,name);
    if (pDVar3 == (mapped_type)0x0) {
      __k = (curr->_M_t).
            super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
            super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
            super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      ppDVar4 = std::__detail::
                _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DataSegment_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::DataSegment_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::DataSegment_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::DataSegment_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)m,(key_type *)__k);
      *ppDVar4 = __k;
      std::
      vector<std::unique_ptr<wasm::DataSegment,std::default_delete<wasm::DataSegment>>,std::allocator<std::unique_ptr<wasm::DataSegment,std::default_delete<wasm::DataSegment>>>>
      ::emplace_back<std::unique_ptr<wasm::DataSegment,std::default_delete<wasm::DataSegment>>>
                ((vector<std::unique_ptr<wasm::DataSegment,std::default_delete<wasm::DataSegment>>,std::allocator<std::unique_ptr<wasm::DataSegment,std::default_delete<wasm::DataSegment>>>>
                  *)v,curr);
      return __k;
    }
    Fatal::Fatal((Fatal *)local_1b0);
    this = (ostream *)(local_1b0 + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(this,"Module::",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (this,(funcName->_M_dataplus)._M_p,funcName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(this,": ",2);
    pDVar1 = (curr->_M_t).
             super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
             super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
             super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
    name_00.super_IString.str._M_str = (char *)psVar5;
    name_00.super_IString.str._M_len = (size_t)*(char **)((long)&(pDVar1->super_Named).name + 8);
    operator<<((wasm *)this,*(ostream **)&(pDVar1->super_Named).name,name_00);
    Fatal::operator<<((Fatal *)local_1b0,(char (*) [16])" already exists");
  }
  Fatal::~Fatal((Fatal *)local_1b0);
}

Assistant:

Elem* addModuleElement(Vector& v,
                       Map& m,
                       std::unique_ptr<Elem> curr,
                       std::string funcName) {
  if (!curr->name.is()) {
    Fatal() << "Module::" << funcName << ": empty name";
  }
  if (getModuleElementOrNull(m, curr->name)) {
    Fatal() << "Module::" << funcName << ": " << curr->name
            << " already exists";
  }
  auto* ret = m[curr->name] = curr.get();
  v.push_back(std::move(curr));
  return ret;
}